

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  exception *e;
  params arguments;
  int rc;
  char **in_stack_000003a0;
  int in_stack_000003ac;
  params *in_stack_000003b0;
  help_type *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  params *in_stack_ffffffffffffffa0;
  byte local_38;
  
  params::params(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
  if ((local_38 & 1) == 0) {
    anon_unknown.dwarf_499d::find_solutions(in_stack_ffffffffffffffa0);
  }
  else {
    this = operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  params::~params((params *)0x109624);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	int rc = EXIT_SUCCESS;

	try {
		const params arguments{argc, argv};
		if (arguments.help_required)
			std::cout << params::help << std::endl;
		else
			find_solutions(arguments);
	}
	catch (const std::exception& e) {
		std::cerr << "\nError: " << e.what() << std::endl;
		rc = EXIT_FAILURE;
	}

	return rc;
}